

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::add_interface_block_pointer
          (CompilerMSL *this,uint32_t ib_var_id,StorageClass storage)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *puVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  SPIRType *pSVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  char (*ts_1) [7];
  ID *__k;
  StorageClass SVar9;
  ID id;
  key_type local_7c;
  uint32_t ib_ptr_ptr_type_id;
  uint32_t local_74;
  string local_70;
  char *local_50;
  StorageClass local_44;
  uint32_t local_40;
  StorageClass storage_local;
  ulong local_38;
  
  if (ib_var_id == 0) {
    id.id = 0;
  }
  else {
    storage_local = storage;
    uVar4 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
    pSVar5 = Compiler::expression_type((Compiler *)this,ib_var_id);
    bVar3 = is_tesc_shader(this);
    if ((bVar3) ||
       ((bVar3 = is_tese_shader(this), bVar3 && ((this->msl_options).raw_buffer_tese_input == true))
       )) {
      local_40 = uVar4 + 1;
      local_74 = uVar4;
      pSVar6 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                         ((Compiler *)this,uVar4,pSVar5);
      *(undefined4 *)&(pSVar6->super_IVariant).field_0xc = 0x20;
      uVar2 = (pSVar5->super_IVariant).self.id;
      (pSVar6->type_alias).id = uVar2;
      (pSVar6->parent_type).id = uVar2;
      pSVar6->pointer = true;
      pSVar6->pointer_depth = pSVar6->pointer_depth + 1;
      __k = &(pSVar5->super_IVariant).self;
      SVar9 = StorageClassStorageBuffer;
      local_44 = storage;
      local_38 = (ulong)uVar4;
      if (storage == StorageClassInput) {
        bVar3 = is_tesc_shader(this);
        if ((bVar3) && ((this->msl_options).multi_patch_workgroup != false)) {
          local_50 = "gl_in";
        }
        else {
          bVar3 = is_tese_shader(this);
          local_50 = "gl_in";
          if (bVar3) {
            SVar9 = (uint)(this->msl_options).raw_buffer_tese_input * 8 + StorageClassWorkgroup;
          }
          else {
            SVar9 = StorageClassWorkgroup;
          }
        }
      }
      else {
        local_50 = "gl_out";
      }
      pSVar6->storage = SVar9;
      puVar1 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      pmVar7 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,__k);
      local_70._M_dataplus._M_p._0_4_ = local_74;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,(key_type *)&local_70);
      Meta::operator=(pmVar8,pmVar7);
      uVar4 = local_40;
      id.id = (int)local_38 + 2;
      ib_ptr_ptr_type_id = local_40;
      pSVar5 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,local_40,pSVar6);
      (pSVar5->parent_type).id = local_74;
      (pSVar5->type_alias).id = __k->id;
      pSVar5->storage = StorageClassFunction;
      pmVar7 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,__k);
      local_70._M_dataplus._M_p._0_4_ = uVar4;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,(key_type *)&local_70);
      Meta::operator=(pmVar8,pmVar7);
      local_70._M_dataplus._M_p._0_4_ = 7;
      local_7c.id = 0;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
                ((Compiler *)this,id.id,&ib_ptr_ptr_type_id,(StorageClass *)&local_70,
                 (int *)&local_7c);
      ::std::__cxx11::string::string((string *)&local_70,local_50,(allocator *)&local_7c);
      Compiler::set_name((Compiler *)this,id,&local_70);
      SVar9 = local_44;
      ::std::__cxx11::string::~string((string *)&local_70);
      if (SVar9 == StorageClassInput) {
        Compiler::set_decoration((Compiler *)this,id,DecorationNonWritable,0);
      }
    }
    else {
      id.id = uVar4 + 1;
      ib_ptr_ptr_type_id = uVar4;
      pSVar6 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                         ((Compiler *)this,uVar4,pSVar5);
      pSVar6->basetype = ControlPointArray;
      uVar2 = (pSVar5->super_IVariant).self.id;
      (pSVar6->type_alias).id = uVar2;
      (pSVar6->parent_type).id = uVar2;
      pSVar6->storage = storage;
      puVar1 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
      pmVar7 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,&(pSVar5->super_IVariant).self);
      local_70._M_dataplus._M_p._0_4_ = uVar4;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,(key_type *)&local_70);
      Meta::operator=(pmVar8,pmVar7);
      local_70._M_dataplus._M_p._0_4_ = 0;
      ts_1 = (char (*) [7])&storage_local;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass&,int>
                ((Compiler *)this,id.id,&ib_ptr_ptr_type_id,(StorageClass *)ts_1,(int *)&local_70);
      ::std::__cxx11::string::string((string *)&local_70,"gl_in",(allocator *)&local_7c);
      Compiler::set_name((Compiler *)this,id,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      join<std::__cxx11::string&,char_const(&)[7]>
                (&local_70,(spirv_cross *)&this->patch_stage_in_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".gl_in",ts_1)
      ;
      local_7c.id = id.id;
      pmVar7 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)puVar1,&local_7c);
      ::std::__cxx11::string::operator=
                ((string *)&(pmVar7->decoration).qualified_alias,(string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return id.id;
}

Assistant:

uint32_t CompilerMSL::add_interface_block_pointer(uint32_t ib_var_id, StorageClass storage)
{
	if (!ib_var_id)
		return 0;

	uint32_t ib_ptr_var_id;
	uint32_t next_id = ir.increase_bound_by(3);
	auto &ib_type = expression_type(ib_var_id);
	if (is_tesc_shader() || (is_tese_shader() && msl_options.raw_buffer_tese_input))
	{
		// Tessellation control per-vertex I/O is presented as an array, so we must
		// do the same with our struct here.
		uint32_t ib_ptr_type_id = next_id++;
		auto &ib_ptr_type = set<SPIRType>(ib_ptr_type_id, ib_type);
		ib_ptr_type.op = OpTypePointer;
		ib_ptr_type.parent_type = ib_ptr_type.type_alias = ib_type.self;
		ib_ptr_type.pointer = true;
		ib_ptr_type.pointer_depth++;
		ib_ptr_type.storage = storage == StorageClassInput ?
		                          ((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
		                                   (is_tese_shader() && msl_options.raw_buffer_tese_input) ?
		                               StorageClassStorageBuffer :
		                               StorageClassWorkgroup) :
		                          StorageClassStorageBuffer;
		ir.meta[ib_ptr_type_id] = ir.meta[ib_type.self];
		// To ensure that get_variable_data_type() doesn't strip off the pointer,
		// which we need, use another pointer.
		uint32_t ib_ptr_ptr_type_id = next_id++;
		auto &ib_ptr_ptr_type = set<SPIRType>(ib_ptr_ptr_type_id, ib_ptr_type);
		ib_ptr_ptr_type.parent_type = ib_ptr_type_id;
		ib_ptr_ptr_type.type_alias = ib_type.self;
		ib_ptr_ptr_type.storage = StorageClassFunction;
		ir.meta[ib_ptr_ptr_type_id] = ir.meta[ib_type.self];

		ib_ptr_var_id = next_id;
		set<SPIRVariable>(ib_ptr_var_id, ib_ptr_ptr_type_id, StorageClassFunction, 0);
		set_name(ib_ptr_var_id, storage == StorageClassInput ? "gl_in" : "gl_out");
		if (storage == StorageClassInput)
			set_decoration(ib_ptr_var_id, DecorationNonWritable);
	}
	else
	{
		// Tessellation evaluation per-vertex inputs are also presented as arrays.
		// But, in Metal, this array uses a very special type, 'patch_control_point<T>',
		// which is a container that can be used to access the control point data.
		// To represent this, a special 'ControlPointArray' type has been added to the
		// SPIRV-Cross type system. It should only be generated by and seen in the MSL
		// backend (i.e. this one).
		uint32_t pcp_type_id = next_id++;
		auto &pcp_type = set<SPIRType>(pcp_type_id, ib_type);
		pcp_type.basetype = SPIRType::ControlPointArray;
		pcp_type.parent_type = pcp_type.type_alias = ib_type.self;
		pcp_type.storage = storage;
		ir.meta[pcp_type_id] = ir.meta[ib_type.self];

		ib_ptr_var_id = next_id;
		set<SPIRVariable>(ib_ptr_var_id, pcp_type_id, storage, 0);
		set_name(ib_ptr_var_id, "gl_in");
		ir.meta[ib_ptr_var_id].decoration.qualified_alias = join(patch_stage_in_var_name, ".gl_in");
	}
	return ib_ptr_var_id;
}